

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_TestCaseWithTestLocation_TestShell::
~TEST_JUnitOutputTest_TestCaseWithTestLocation_TestShell
          (TEST_JUnitOutputTest_TestCaseWithTestLocation_TestShell *this)

{
  TEST_JUnitOutputTest_TestCaseWithTestLocation_TestShell *this_local;
  
  ~TEST_JUnitOutputTest_TestCaseWithTestLocation_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(JUnitOutputTest, TestCaseWithTestLocation)
{
    junitOutput->setPackageName("packagename");
    testCaseRunner->start()
            .withGroup("groupname")
            .withTest("testname").inFile("MySource.c").onLine(159)
            .end();

    outputFile = fileSystem.file("cpputest_packagename_groupname.xml");

    STRCMP_EQUAL("<testcase classname=\"packagename.groupname\" name=\"testname\" assertions=\"0\" time=\"0.000\" file=\"MySource.c\" line=\"159\">\n", outputFile->line(5));
}